

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinKrylovDemo_ls.c
# Opt level: O3

int PrecSolveBD(N_Vector cc,N_Vector cscale,N_Vector fval,N_Vector fscale,N_Vector vv,
               void *user_data)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  lVar1 = (long)user_data + 200;
  lVar5 = 0;
  lVar3 = 0;
  do {
    lVar2 = 0;
    lVar4 = lVar5;
    do {
      SUNDlsMat_denseGETRS
                (*(undefined8 *)(lVar1 + -200 + lVar2 * 8),6,*(undefined8 *)(lVar1 + lVar2 * 8),
                 *(long *)((long)vv->content + 0x10) + lVar4);
      lVar2 = lVar2 + 1;
      lVar4 = lVar4 + 0xf0;
    } while (lVar2 != 5);
    lVar3 = lVar3 + 1;
    lVar5 = lVar5 + 0x30;
    lVar1 = lVar1 + 0x28;
  } while (lVar3 != 5);
  return 0;
}

Assistant:

static int PrecSolveBD(N_Vector cc, N_Vector cscale, N_Vector fval,
                       N_Vector fscale, N_Vector vv, void* user_data)
{
  sunrealtype **Pxy, *vxy;
  sunindextype *piv, jx, jy;
  UserData data;

  data = (UserData)user_data;

  for (jx = 0; jx < MX; jx++)
  {
    for (jy = 0; jy < MY; jy++)
    {
      /* For each (jx,jy), solve a linear system of size NUM_SPECIES.
         vxy is the address of the corresponding portion of the vector vv;
         Pxy is the address of the corresponding block of the matrix P;
         piv is the address of the corresponding block of the array pivot. */
      vxy = IJ_Vptr(vv, jx, jy);
      Pxy = (data->P)[jx][jy];
      piv = (data->pivot)[jx][jy];
      SUNDlsMat_denseGETRS(Pxy, NUM_SPECIES, piv, vxy);

    } /* end of jy loop */

  } /* end of jx loop */

  return (0);
}